

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_internal_add_path
          (GeneratedCodeInfo_Annotation *this,int32 value)

{
  int iVar1;
  
  iVar1 = (this->path_).current_size_;
  if (iVar1 == (this->path_).total_size_) {
    RepeatedField<int>::Reserve(&this->path_,iVar1 + 1);
    iVar1 = (this->path_).current_size_;
  }
  (this->path_).current_size_ = iVar1 + 1;
  *(int32 *)((long)(this->path_).arena_or_elements_ + (long)iVar1 * 4) = value;
  return;
}

Assistant:

inline void GeneratedCodeInfo_Annotation::_internal_add_path(::PROTOBUF_NAMESPACE_ID::int32 value) {
  path_.Add(value);
}